

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS
ref_metric_gradation_at_complexity
          (REF_DBL *metric,REF_GRID ref_grid,REF_DBL gradation,REF_DBL complexity)

{
  REF_NODE pRVar1;
  double dVar2;
  uint uVar3;
  ulong uVar4;
  REF_DBL *pRVar5;
  ulong uVar6;
  undefined8 uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  char *pcVar11;
  REF_STATUS ref_private_macro_code_rss;
  REF_STATUS RVar12;
  REF_DBL current_complexity;
  double local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  REF_DBL local_68;
  REF_DBL *local_50;
  double local_48;
  
  pRVar1 = ref_grid->node;
  local_80 = *(double *)(&DAT_0021ee50 + (ulong)(ref_grid->twod == 0) * 8);
  local_48 = complexity;
  if (complexity <= -complexity) {
    local_48 = -complexity;
  }
  local_50 = metric + 4;
  local_78 = 0;
  uStack_74 = 0;
  uStack_70 = 0;
  uStack_6c = 0x3ff00000;
  iVar9 = 0;
  local_68 = complexity;
  do {
    uVar3 = ref_metric_complexity(metric,ref_grid,&current_complexity);
    uVar4 = (ulong)uVar3;
    if (iVar9 == 0x14) {
      if (uVar3 == 0) {
        dVar2 = current_complexity * 1e+20;
        if (dVar2 <= -dVar2) {
          dVar2 = -dVar2;
        }
        if (dVar2 <= local_48) {
          RVar12 = 4;
        }
        else {
          RVar12 = 0;
          local_78 = 0;
          uStack_74 = 0;
          uStack_70 = 0;
          uStack_6c = 0x3ff00000;
          pRVar5 = metric;
          for (lVar10 = 0; lVar10 < pRVar1->max; lVar10 = lVar10 + 1) {
            if (-1 < pRVar1->global[lVar10]) {
              for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
                dVar2 = pow(local_68 / current_complexity,local_80);
                pRVar5[lVar8] = dVar2 * pRVar5[lVar8];
              }
              if (ref_grid->twod != 0) {
                metric[lVar10 * 6 + 2] = 0.0;
                metric[lVar10 * 6 + 4] = (REF_DBL)CONCAT44(uStack_74,local_78);
                (metric + lVar10 * 6 + 4)[1] = (REF_DBL)CONCAT44(uStack_6c,uStack_70);
              }
            }
            pRVar5 = pRVar5 + 6;
          }
        }
      }
      else {
        pcVar11 = "cmp";
        uVar7 = 0x45c;
LAB_0018a060:
        RVar12 = (REF_STATUS)uVar4;
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar7,"ref_metric_gradation_at_complexity",uVar4,pcVar11);
      }
      return RVar12;
    }
    if (uVar3 != 0) {
      pcVar11 = "cmp";
      uVar7 = 0x43b;
      goto LAB_0018a060;
    }
    dVar2 = current_complexity * 1e+20;
    if (dVar2 <= -dVar2) {
      dVar2 = -dVar2;
    }
    if (dVar2 <= local_48) {
      if (ref_grid->mpi->id != 0) {
        return 4;
      }
      printf("div zero target %.18e current %.18e\n",local_68._0_4_);
      return 4;
    }
    pRVar5 = metric;
    for (lVar10 = 0; lVar10 < pRVar1->max; lVar10 = lVar10 + 1) {
      if (-1 < pRVar1->global[lVar10]) {
        for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
          dVar2 = pow(local_68 / current_complexity,local_80);
          pRVar5[lVar8] = dVar2 * pRVar5[lVar8];
        }
        if (ref_grid->twod != 0) {
          metric[lVar10 * 6 + 2] = 0.0;
          metric[lVar10 * 6 + 4] = (REF_DBL)CONCAT44(uStack_74,local_78);
          (metric + lVar10 * 6 + 4)[1] = (REF_DBL)CONCAT44(uStack_6c,uStack_70);
        }
      }
      pRVar5 = pRVar5 + 6;
    }
    if (1.0 <= gradation) {
      uVar3 = ref_metric_metric_space_gradation(metric,ref_grid,gradation);
      if (uVar3 != 0) {
        uVar4 = (ulong)uVar3;
        pcVar11 = "gradation";
        uVar7 = 0x452;
        goto LAB_0018a060;
      }
    }
    else {
      uVar3 = ref_metric_mixed_space_gradation(metric,ref_grid,-1.0,-1.0);
      if (uVar3 != 0) {
        uVar4 = (ulong)uVar3;
        pcVar11 = "gradation";
        uVar7 = 0x44f;
        goto LAB_0018a060;
      }
    }
    if (ref_grid->twod != 0) {
      uVar4 = (ulong)(uint)pRVar1->max;
      if (pRVar1->max < 1) {
        uVar4 = 0;
      }
      pRVar5 = local_50;
      for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
        if (-1 < pRVar1->global[uVar6]) {
          pRVar5[-2] = 0.0;
          *pRVar5 = (REF_DBL)CONCAT44(uStack_74,local_78);
          pRVar5[1] = (REF_DBL)CONCAT44(uStack_6c,uStack_70);
        }
        pRVar5 = pRVar5 + 6;
      }
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_metric_gradation_at_complexity(REF_DBL *metric,
                                                      REF_GRID ref_grid,
                                                      REF_DBL gradation,
                                                      REF_DBL complexity) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT relaxations;
  REF_DBL current_complexity;
  REF_DBL complexity_scale;
  REF_INT node, i;

  complexity_scale = 2.0 / 3.0;
  if (ref_grid_twod(ref_grid)) {
    complexity_scale = 1.0;
  }

  for (relaxations = 0; relaxations < 20; relaxations++) {
    RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
    if (!ref_math_divisible(complexity, current_complexity)) {
      if (ref_mpi_once(ref_grid_mpi(ref_grid)))
        printf("div zero target %.18e current %.18e\n", complexity,
               current_complexity);
      return REF_DIV_ZERO;
    }
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 6; i++) {
        metric[i + 6 * node] *=
            pow(complexity / current_complexity, complexity_scale);
      }
      if (ref_grid_twod(ref_grid)) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
    if (gradation < 1.0) {
      RSS(ref_metric_mixed_space_gradation(metric, ref_grid, -1.0, -1.0),
          "gradation");
    } else {
      RSS(ref_metric_metric_space_gradation(metric, ref_grid, gradation),
          "gradation");
    }
    if (ref_grid_twod(ref_grid)) {
      each_ref_node_valid_node(ref_node, node) {
        metric[2 + 6 * node] = 0.0;
        metric[4 + 6 * node] = 0.0;
        metric[5 + 6 * node] = 1.0;
      }
    }
  }
  RSS(ref_metric_complexity(metric, ref_grid, &current_complexity), "cmp");
  if (!ref_math_divisible(complexity, current_complexity)) {
    return REF_DIV_ZERO;
  }
  each_ref_node_valid_node(ref_node, node) {
    for (i = 0; i < 6; i++) {
      metric[i + 6 * node] *=
          pow(complexity / current_complexity, complexity_scale);
    }
    if (ref_grid_twod(ref_grid)) {
      metric[2 + 6 * node] = 0.0;
      metric[4 + 6 * node] = 0.0;
      metric[5 + 6 * node] = 1.0;
    }
  }

  return REF_SUCCESS;
}